

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.hpp
# Opt level: O2

unique_ptr<Catch::CompactReporter> __thiscall
Catch::Detail::make_unique<Catch::CompactReporter,Catch::ReporterConfig>
          (Detail *this,ReporterConfig *args)

{
  CompactReporter *this_00;
  
  this_00 = (CompactReporter *)operator_new(0x90);
  CompactReporter::StreamingReporterBase(this_00,args);
  *(CompactReporter **)this = this_00;
  return (unique_ptr<Catch::CompactReporter>)(CompactReporter *)this;
}

Assistant:

unique_ptr<T> make_unique(Args&&... args) {
        return unique_ptr<T>(new T(CATCH_FORWARD(args)...));
    }